

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O2

int __thiscall CVmFile::dup(CVmFile *this,int __fd)

{
  long lVar1;
  osfildef *poVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000034;
  
  poVar2 = osfdup(this->fp_,(char *)CONCAT44(in_register_00000034,__fd));
  if (poVar2 == (osfildef *)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = (undefined8 *)operator_new(0x10);
    lVar1 = this->seek_base_;
    *puVar3 = poVar2;
    puVar3[1] = lVar1;
  }
  return (int)puVar3;
}

Assistant:

CVmFile *dup(const char *mode)
    {
        /* duplicate our file handle */
        osfildef *fpdup = osfdup(fp_, mode);
        if (fpdup == 0)
            return 0;

        /* create a new CVmFile wrapper for the new handle */
        return new CVmFile(fpdup, seek_base_);
    }